

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator
          (RuleBasedCollator *this,uint8_t *bin,int32_t length,RuleBasedCollator *base,
          UErrorCode *errorCode)

{
  CollationTailoring *pCVar1;
  char *size;
  
  Collator::Collator(&this->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_003a8710;
  this->data = (CollationData *)0x0;
  this->settings = (CollationSettings *)0x0;
  this->tailoring = (CollationTailoring *)0x0;
  this->cacheEntry = (CollationCacheEntry *)0x0;
  size = "";
  Locale::Locale(&this->validLocale,"",(char *)0x0,(char *)0x0,(char *)0x0);
  this->explicitlySetAttributes = 0;
  this->actualLocaleIsSameAsValid = '\0';
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((length == 0 || bin == (uint8_t *)0x0) || base == (RuleBasedCollator *)0x0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pCVar1 = CollationRoot::getRoot(errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (base->tailoring == pCVar1) {
          pCVar1 = (CollationTailoring *)UMemory::operator_new((UMemory *)0x190,(size_t)size);
          if (pCVar1 == (CollationTailoring *)0x0) {
            pCVar1 = (CollationTailoring *)0x0;
          }
          else {
            CollationTailoring::CollationTailoring(pCVar1,base->tailoring->settings);
          }
          if ((pCVar1 == (CollationTailoring *)0x0) ||
             (pCVar1->settings == (CollationSettings *)0x0)) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            CollationDataReader::read((int)base->tailoring,bin,(ulong)(uint)length);
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              Locale::setToBogus(&pCVar1->actualLocale);
              adoptTailoring(this,pCVar1,errorCode);
              pCVar1 = (CollationTailoring *)0x0;
            }
          }
          if (pCVar1 != (CollationTailoring *)0x0) {
            (*(pCVar1->super_SharedObject).super_UObject._vptr_UObject[1])(pCVar1);
            return;
          }
        }
        else {
          *errorCode = U_UNSUPPORTED_ERROR;
        }
      }
    }
  }
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const uint8_t *bin, int32_t length,
                                     const RuleBasedCollator *base, UErrorCode &errorCode)
        : data(NULL),
          settings(NULL),
          tailoring(NULL),
          cacheEntry(NULL),
          validLocale(""),
          explicitlySetAttributes(0),
          actualLocaleIsSameAsValid(FALSE) {
    if(U_FAILURE(errorCode)) { return; }
    if(bin == NULL || length == 0 || base == NULL) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    const CollationTailoring *root = CollationRoot::getRoot(errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(base->tailoring != root) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    LocalPointer<CollationTailoring> t(new CollationTailoring(base->tailoring->settings));
    if(t.isNull() || t->isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    CollationDataReader::read(base->tailoring, bin, length, *t, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    t->actualLocale.setToBogus();
    adoptTailoring(t.orphan(), errorCode);
}